

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdPath.c
# Opt level: O0

Vec_Bit_t * Sbc_ManCriticalPath(Gia_Man_t *p)

{
  int *p_00;
  int iVar1;
  Vec_Bit_t *vPath_00;
  Gia_Obj_t *pObj;
  int local_34;
  Vec_Bit_t *vPath;
  int nLevels;
  int Slack;
  int iDriver;
  int k;
  int *pLevels;
  Gia_Man_t *p_local;
  
  _iDriver = (int *)0x0;
  pLevels = (int *)p;
  if (p->pManTime == (void *)0x0) {
    local_34 = Gia_ManLutLevel(p,(int **)&iDriver);
  }
  else {
    local_34 = Gia_ManLutLevelWithBoxes(p);
  }
  iVar1 = Gia_ManObjNum((Gia_Man_t *)pLevels);
  vPath_00 = Vec_BitStart(iVar1);
  if (*(long *)(pLevels + 0xb4) != 0) {
    _iDriver = Vec_IntArray(*(Vec_Int_t **)(pLevels + 0x28));
  }
  Gia_ManIncrementTravId((Gia_Man_t *)pLevels);
  for (Slack = 0; iVar1 = Vec_IntSize(*(Vec_Int_t **)(pLevels + 0x12)), p_00 = pLevels,
      Slack < iVar1; Slack = Slack + 1) {
    pObj = Gia_ManCo((Gia_Man_t *)pLevels,Slack);
    iVar1 = Gia_ObjFaninId0p((Gia_Man_t *)p_00,pObj);
    if ((_iDriver[iVar1] == local_34) && (iVar1 != 0)) {
      Sbc_ManCriticalPath_rec((Gia_Man_t *)pLevels,_iDriver,iVar1,_iDriver[iVar1],vPath_00,1);
    }
  }
  if ((*(long *)(pLevels + 0xb4) == 0) && (_iDriver != (int *)0x0)) {
    free(_iDriver);
    _iDriver = (int *)0x0;
  }
  Sbc_ManAddInternalToPath((Gia_Man_t *)pLevels,vPath_00);
  return vPath_00;
}

Assistant:

Vec_Bit_t * Sbc_ManCriticalPath( Gia_Man_t * p )
{
    int * pLevels = NULL, k, iDriver, Slack = 1;
    int nLevels = p->pManTime ? Gia_ManLutLevelWithBoxes(p) : Gia_ManLutLevel(p, &pLevels);
    Vec_Bit_t * vPath = Vec_BitStart( Gia_ManObjNum(p) );
    if ( p->pManTime )
        pLevels = Vec_IntArray( p->vLevels );
    Gia_ManIncrementTravId( p );
    Gia_ManForEachCoDriverId( p, iDriver, k )
        if ( (pLevels[iDriver] == nLevels) && iDriver )
            Sbc_ManCriticalPath_rec( p, pLevels, iDriver, pLevels[iDriver], vPath, Slack );
    if ( !p->pManTime )
        ABC_FREE( pLevels );
    Sbc_ManAddInternalToPath( p, vPath );
    return vPath;
}